

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O3

t_object * __thiscall xemmai::ast::t_lambda::f_code(t_lambda *this,t_object *a_module)

{
  t_object *ptVar1;
  
  ptVar1 = t_code::f_instantiate
                     (a_module,(this->super_t_scope).v_shared,this->v_variadic,
                      (long)(this->super_t_scope).v_privates.
                            super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->super_t_scope).v_privates.
                            super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3,
                      (this->super_t_scope).v_shareds,this->v_arguments,
                      (this->v_arguments -
                      ((long)(this->v_defaults).
                             super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->v_defaults).
                             super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3)) -
                      (ulong)this->v_variadic);
  ptVar1 = t_script::f_slot((t_script *)a_module->v_data,ptVar1);
  return ptVar1;
}

Assistant:

t_object* t_lambda::f_code(t_object* a_module)
{
	size_t minimum = v_arguments - v_defaults.size();
	if (v_variadic) --minimum;
	return a_module->f_as<t_script>().f_slot(t_code::f_instantiate(a_module, v_shared, v_variadic, v_privates.size(), v_shareds, v_arguments, minimum));
}